

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
CheckPackageMempoolAcceptResult_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Package *txns,PackageMempoolAcceptResult *result,
          bool expect_valid,CTxMemPool *mempool)

{
  undefined8 *puVar1;
  ModeState MVar2;
  ResultType RVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *pcVar5;
  pointer pcVar6;
  pointer pcVar7;
  long lVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  _Alloc_hider _Var11;
  _Alloc_hider _Var12;
  _Alloc_hider _Var13;
  char *pcVar14;
  const_iterator cVar15;
  mapped_type *pmVar16;
  undefined7 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *plVar19;
  CTxMemPool *args_1;
  key_type *__k;
  ResultType RVar20;
  _List_node_base *p_Var21;
  long in_FS_OFFSET;
  bool bVar22;
  bool bVar23;
  initializer_list<uint256> __l;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  cluster;
  undefined1 local_b9 [9];
  undefined1 local_b0;
  undefined1 local_a8 [32];
  uchar uStack_88;
  string local_78;
  string local_58;
  long local_38;
  
  pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT71(in_register_00000009,expect_valid);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MVar2 = (result->m_state).super_ValidationState<PackageValidationResult>.m_mode;
  if ((int)pbVar17 == 0) {
    if (MVar2 != M_VALID) goto LAB_0083d612;
    ValidationState<PackageValidationResult>::ToString_abi_cxx11_
              (&local_58,(ValidationState<PackageValidationResult> *)result);
    tinyformat::format<std::__cxx11::string>
              ((string *)local_a8,(tinyformat *)"Package validation unexpectedly succeeded. %s",
               (char *)&local_58,pbVar17);
  }
  else {
    if (MVar2 != M_INVALID) {
LAB_0083d612:
      pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (txns->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (txns->
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if ((result->m_state).super_ValidationState<PackageValidationResult>.m_result != PCKG_POLICY)
      {
        pcVar14 = (char *)((long)pbVar4 - (long)pbVar17 >> 4);
        pcVar5 = (char *)(result->m_tx_results)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        if (pcVar14 != pcVar5) {
          local_78._M_dataplus._M_p = pcVar5;
          local_58._M_dataplus._M_p = pcVar14;
          tinyformat::format<unsigned_long,unsigned_long>
                    ((string *)local_a8,
                     (tinyformat *)"txns size %u does not match tx results size %u",
                     (char *)&local_58,(unsigned_long *)&local_78,(unsigned_long *)mempool);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           )._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload = puVar1;
          _Var10._M_p._1_7_ = local_a8._1_7_;
          _Var10._M_p._0_1_ = local_a8[0];
          if (_Var10._M_p == local_a8 + 0x10) {
            *puVar1 = CONCAT71(local_a8._17_7_,local_a8[0x10]);
            *(ulong *)((long)&(__return_storage_ptr__->
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x18) = CONCAT71(local_a8._25_7_,local_a8[0x18]);
          }
          else {
            (__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = _Var10._M_p;
            *(ulong *)((long)&(__return_storage_ptr__->
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x10) = CONCAT71(local_a8._17_7_,local_a8[0x10]);
          }
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length = CONCAT71(local_a8._9_7_,local_a8[8]);
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = true;
          goto LAB_0083da7b;
        }
      }
      if (pbVar17 != pbVar4) {
        args_1 = mempool;
        do {
          pcVar6 = (pbVar17->_M_dataplus)._M_p;
          __k = (key_type *)(pcVar6 + 0x59);
          pbVar18 = pbVar4;
          cVar15 = std::
                   _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   ::find(&(result->m_tx_results)._M_t,__k);
          if ((_Rb_tree_header *)cVar15._M_node ==
              &(result->m_tx_results)._M_t._M_impl.super__Rb_tree_header) {
            base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
            tinyformat::format<std::__cxx11::string>
                      ((string *)local_a8,(tinyformat *)"result not found for tx %s",
                       (char *)&local_58,pbVar18);
            goto LAB_0083d9fa;
          }
          pmVar16 = std::
                    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    ::at(&result->m_tx_results,__k);
          RVar3 = pmVar16->m_result_type;
          if ((expect_valid) &&
             ((pmVar16->m_state).super_ValidationState<TxValidationResult>.m_mode == M_INVALID)) {
            base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
            ValidationState<TxValidationResult>::ToString_abi_cxx11_
                      (&local_78,&(pmVar16->m_state).super_ValidationState<TxValidationResult>);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      ((string *)local_a8,(tinyformat *)"tx %s unexpectedly failed: %s",
                       (char *)&local_58,&local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
            puVar1 = (undefined8 *)
                     ((long)&(__return_storage_ptr__->
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 0x10);
            *(undefined8 **)
             &(__return_storage_ptr__->
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload = puVar1;
            pcVar6 = local_a8 + 0x10;
            _Var12._M_p._1_7_ = local_a8._1_7_;
            _Var12._M_p._0_1_ = local_a8[0];
            if (_Var12._M_p == pcVar6) {
              *puVar1 = CONCAT71(local_a8._17_7_,local_a8[0x10]);
              *(ulong *)((long)&(__return_storage_ptr__->
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload + 0x18) = CONCAT71(local_a8._25_7_,local_a8[0x18]);
            }
            else {
              (__return_storage_ptr__->
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p = _Var12._M_p;
              *(ulong *)((long)&(__return_storage_ptr__->
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload + 0x10) = CONCAT71(local_a8._17_7_,local_a8[0x10]);
            }
            (__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_string_length = CONCAT71(local_a8._9_7_,local_a8[8]);
            local_a8[0] = SUB81(pcVar6,0);
            local_a8._1_7_ = (undefined7)((ulong)pcVar6 >> 8);
            local_a8[8] = '\0';
            local_a8[9] = '\0';
            local_a8[10] = '\0';
            local_a8[0xb] = '\0';
            local_a8[0xc] = '\0';
            local_a8[0xd] = '\0';
            local_a8[0xe] = '\0';
            local_a8[0xf] = '\0';
            local_a8[0x10] = '\0';
            (__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged = true;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            goto LAB_0083da44;
          }
          if (100 < (pmVar16->m_replaced_transactions).
                    super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl._M_node._M_size) {
            base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
            tinyformat::format<std::__cxx11::string>
                      ((string *)local_a8,
                       (tinyformat *)"tx %s result replaced too many transactions",(char *)&local_58
                       ,pbVar18);
            goto LAB_0083d9fa;
          }
          plVar19 = &pmVar16->m_replaced_transactions;
          RVar20 = RVar3;
          if ((plVar19->
              super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)plVar19) {
            if (((pmVar16->m_wtxids_fee_calculations).
                 super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                 ._M_engaged == true) &&
               (0x40 < (ulong)((long)*(pointer *)
                                      ((long)&(pmVar16->m_wtxids_fee_calculations).
                                              super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                                              ._M_payload.
                                              super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                                              .
                                              super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                                              ._M_payload._M_value.
                                              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                      + 8) -
                              *(long *)&(pmVar16->m_wtxids_fee_calculations).
                                        super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                                        ._M_payload._M_value.
                                        super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                        ._M_impl))) {
              base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
              tinyformat::format<std::__cxx11::string>
                        ((string *)local_a8,
                         (tinyformat *)"tx %s was part of a too-large package RBF subpackage",
                         (char *)&local_58,pbVar18);
              goto LAB_0083d9fa;
            }
            if (mempool != (CTxMemPool *)0x0) {
              local_b0 = 0;
              local_b9._1_8_ = &mempool->cs;
              std::unique_lock<std::recursive_mutex>::lock
                        ((unique_lock<std::recursive_mutex> *)(local_b9 + 1));
              if (((pmVar16->m_wtxids_fee_calculations).
                   super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                   ._M_engaged == true) &&
                 ((long)*(pointer *)
                         ((long)&(pmVar16->m_wtxids_fee_calculations).
                                 super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                                 ._M_payload._M_value.
                                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                         + 8) -
                  *(long *)&(pmVar16->m_wtxids_fee_calculations).
                            super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                            ._M_payload._M_value.
                            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            ._M_impl == 0x40)) {
                pcVar7 = (pbVar17->_M_dataplus)._M_p;
                local_a8[0x10] = (undefined1)*(undefined8 *)(pcVar7 + 0x49);
                local_a8._17_7_ = (undefined7)((ulong)*(undefined8 *)(pcVar7 + 0x49) >> 8);
                local_a8[0x18] = (undefined1)*(undefined8 *)(pcVar7 + 0x51);
                local_a8._25_7_ = (undefined7)((ulong)*(undefined8 *)(pcVar7 + 0x51) >> 8);
                local_a8[0] = (undefined1)*(undefined8 *)(pcVar7 + 0x39);
                local_a8._1_7_ = (undefined7)((ulong)*(undefined8 *)(pcVar7 + 0x39) >> 8);
                local_a8[8] = (undefined1)*(undefined8 *)(pcVar7 + 0x41);
                local_a8._9_7_ = (undefined7)((ulong)*(undefined8 *)(pcVar7 + 0x41) >> 8);
                pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_b9;
                __l._M_len = 1;
                __l._M_array = (iterator)local_a8;
                std::vector<uint256,_std::allocator<uint256>_>::vector
                          ((vector<uint256,_std::allocator<uint256>_> *)&local_58,__l,
                           (allocator_type *)pbVar18);
                CTxMemPool::GatherClusters
                          ((vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                            *)&local_78,mempool,
                           (vector<uint256,_std::allocator<uint256>_> *)&local_58);
                if (local_58._M_dataplus._M_p != (char *)0x0) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  local_58.field_2._M_allocated_capacity -
                                  (long)local_58._M_dataplus._M_p);
                }
                if (local_78._M_string_length - (long)local_78._M_dataplus._M_p != 0x10) {
                  base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
                  tinyformat::format<std::__cxx11::string>
                            ((string *)local_a8,
                             (tinyformat *)
                             "tx %s has too many ancestors or descendants for a package rbf",
                             (char *)&local_58,pbVar18);
                  puVar1 = (undefined8 *)
                           ((long)&(__return_storage_ptr__->
                                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                   )._M_payload.
                                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ._M_payload + 0x10);
                  *(undefined8 **)
                   &(__return_storage_ptr__->
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    )._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload = puVar1;
                  pcVar6 = local_a8 + 0x10;
                  _Var13._M_p._1_7_ = local_a8._1_7_;
                  _Var13._M_p._0_1_ = local_a8[0];
                  if (_Var13._M_p == pcVar6) {
                    *puVar1 = CONCAT71(local_a8._17_7_,local_a8[0x10]);
                    *(ulong *)((long)&(__return_storage_ptr__->
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      )._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._M_payload + 0x18) = CONCAT71(local_a8._25_7_,local_a8[0x18])
                    ;
                  }
                  else {
                    (__return_storage_ptr__->
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    )._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_dataplus._M_p = _Var13._M_p;
                    *(ulong *)((long)&(__return_storage_ptr__->
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      )._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._M_payload + 0x10) = CONCAT71(local_a8._17_7_,local_a8[0x10])
                    ;
                  }
                  (__return_storage_ptr__->
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_string_length = CONCAT71(local_a8._9_7_,local_a8[8]);
                  local_a8[0] = SUB81(pcVar6,0);
                  local_a8._1_7_ = (undefined7)((ulong)pcVar6 >> 8);
                  local_a8[8] = '\0';
                  local_a8[9] = '\0';
                  local_a8[10] = '\0';
                  local_a8[0xb] = '\0';
                  local_a8[0xc] = '\0';
                  local_a8[0xd] = '\0';
                  local_a8[0xe] = '\0';
                  local_a8[0xf] = '\0';
                  local_a8[0x10] = '\0';
                  (__return_storage_ptr__->
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged = true;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._M_dataplus._M_p != &local_58.field_2) {
                    operator_delete(local_58._M_dataplus._M_p,
                                    local_58.field_2._M_allocated_capacity + 1);
                  }
                  if (local_78._M_dataplus._M_p != (char *)0x0) {
                    operator_delete(local_78._M_dataplus._M_p,
                                    local_78.field_2._M_allocated_capacity -
                                    (long)local_78._M_dataplus._M_p);
                  }
                  std::unique_lock<std::recursive_mutex>::~unique_lock
                            ((unique_lock<std::recursive_mutex> *)(local_b9 + 1));
                  goto LAB_0083da7b;
                }
                if (local_78._M_dataplus._M_p != (char *)0x0) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity -
                                  (long)local_78._M_dataplus._M_p);
                }
              }
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        ((unique_lock<std::recursive_mutex> *)(local_b9 + 1));
              RVar20 = pmVar16->m_result_type;
            }
          }
          bVar22 = RVar3 == VALID;
          bVar23 = RVar20 == MEMPOOL_ENTRY;
          if ((bVar23 || bVar22) !=
              (pmVar16->m_base_fees).super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged) {
            base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
            local_78._M_dataplus._M_p = "not ";
            if (bVar23 || bVar22) {
              local_78._M_dataplus._M_p = "";
            }
            tinyformat::format<std::__cxx11::string,char_const*>
                      ((string *)local_a8,(tinyformat *)"tx %s result should %shave m_base_fees",
                       (char *)&local_58,&local_78,(char **)args_1);
            goto LAB_0083d9fa;
          }
          if ((bVar23 || bVar22) !=
              (pmVar16->m_vsize).super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_engaged) {
            base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
            local_78._M_dataplus._M_p = "not ";
            if (bVar23 || bVar22) {
              local_78._M_dataplus._M_p = "";
            }
            tinyformat::format<std::__cxx11::string,char_const*>
                      ((string *)local_a8,(tinyformat *)"tx %s result should %shave m_vsize",
                       (char *)&local_58,&local_78,(char **)args_1);
            goto LAB_0083d9fa;
          }
          if ((RVar20 == DIFFERENT_WITNESS) !=
              (pmVar16->m_other_wtxid).super__Optional_base<uint256,_true,_true>._M_payload.
              super__Optional_payload_base<uint256>._M_engaged) {
            base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
            local_78._M_dataplus._M_p = "not ";
            if (RVar20 == DIFFERENT_WITNESS) {
              local_78._M_dataplus._M_p = "";
            }
            tinyformat::format<std::__cxx11::string,char_const*>
                      ((string *)local_a8,(tinyformat *)"tx %s result should %shave m_other_wtxid",
                       (char *)&local_58,&local_78,(char **)args_1);
            goto LAB_0083d9fa;
          }
          bVar22 = (pmVar16->m_effective_feerate).super__Optional_base<CFeeRate,_true,_true>.
                   _M_payload.super__Optional_payload_base<CFeeRate>._M_engaged;
          if (bVar22 != ((pmVar16->m_state).super_ValidationState<TxValidationResult>.m_result ==
                         TX_RECONSIDERABLE || RVar20 == VALID)) {
            base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
            local_78._M_dataplus._M_p = "not ";
            if (RVar3 == VALID) {
              local_78._M_dataplus._M_p = "";
            }
            tinyformat::format<std::__cxx11::string,char_const*>
                      ((string *)local_a8,
                       (tinyformat *)"tx %s result should %shave m_effective_feerate",
                       (char *)&local_58,&local_78,(char **)args_1);
            goto LAB_0083d9fa;
          }
          if ((pmVar16->m_wtxids_fee_calculations).
              super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
              ._M_engaged != bVar22) {
            base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
            local_78._M_dataplus._M_p = "not ";
            if (RVar3 == VALID) {
              local_78._M_dataplus._M_p = "";
            }
            tinyformat::format<std::__cxx11::string,char_const*>
                      ((string *)local_a8,
                       (tinyformat *)"tx %s result should %shave m_effective_feerate",
                       (char *)&local_58,&local_78,(char **)args_1);
            goto LAB_0083d9fa;
          }
          pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_a8 + 1);
          if (mempool != (CTxMemPool *)0x0) {
            pcVar7 = (pbVar17->_M_dataplus)._M_p;
            local_a8[0] = '\0';
            local_a8._17_7_ = (undefined7)*(undefined8 *)(pcVar7 + 0x49);
            local_a8[0x18] = (undefined1)((ulong)*(undefined8 *)(pcVar7 + 0x49) >> 0x38);
            local_a8._25_7_ = (undefined7)*(undefined8 *)(pcVar7 + 0x51);
            uStack_88 = (uchar)((ulong)*(undefined8 *)(pcVar7 + 0x51) >> 0x38);
            local_a8._1_7_ = (undefined7)*(undefined8 *)(pcVar7 + 0x39);
            local_a8[8] = (undefined1)((ulong)*(undefined8 *)(pcVar7 + 0x39) >> 0x38);
            local_a8._9_7_ = (undefined7)*(undefined8 *)(pcVar7 + 0x41);
            local_a8[0x10] = (undefined1)((ulong)*(undefined8 *)(pcVar7 + 0x41) >> 0x38);
            bVar22 = CTxMemPool::exists(mempool,(GenTxid *)local_a8);
            if ((RVar20 != INVALID) != bVar22) {
              base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
              local_78._M_dataplus._M_p = "not ";
              if (RVar20 != INVALID) {
                local_78._M_dataplus._M_p = "";
              }
              tinyformat::format<std::__cxx11::string,char_const*>
                        ((string *)local_a8,(tinyformat *)"tx %s should %sbe in mempool",
                         (char *)&local_58,&local_78,(char **)args_1);
              goto LAB_0083d9fa;
            }
            p_Var21 = (_List_node_base *)plVar19;
            if (((pbVar17->_M_dataplus)._M_p[0x38] == '\x01') &&
               (pmVar16->m_result_type == DIFFERENT_WITNESS)) {
              local_a8[0] = '\x01';
              uVar9 = *(undefined8 *)(__k->super_base_blob<256U>).m_data._M_elems;
              local_a8._17_7_ = (undefined7)*(undefined8 *)(pcVar6 + 0x69);
              local_a8[0x18] = (undefined1)((ulong)*(undefined8 *)(pcVar6 + 0x69) >> 0x38);
              local_a8._25_7_ = (undefined7)*(undefined8 *)(pcVar6 + 0x71);
              uStack_88 = (uchar)((ulong)*(undefined8 *)(pcVar6 + 0x71) >> 0x38);
              local_a8._1_7_ = (undefined7)uVar9;
              local_a8[8] = (undefined1)((ulong)uVar9 >> 0x38);
              local_a8._9_7_ = (undefined7)*(undefined8 *)(pcVar6 + 0x61);
              local_a8[0x10] = (undefined1)((ulong)*(undefined8 *)(pcVar6 + 0x61) >> 0x38);
              bVar22 = CTxMemPool::exists(mempool,(GenTxid *)local_a8);
              if (bVar22) {
                base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
                tinyformat::format<std::__cxx11::string>
                          ((string *)local_a8,(tinyformat *)"wtxid %s should not be in mempool",
                           (char *)&local_58,pbVar18);
                goto LAB_0083d9fa;
              }
            }
            while (p_Var21 = (((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                *)&p_Var21->_M_next)->_M_impl)._M_node.super__List_node_base._M_next
                  , p_Var21 != (_List_node_base *)plVar19) {
              lVar8 = (long)p_Var21[1]._M_next;
              local_a8[0] = '\0';
              local_a8._17_7_ = (undefined7)*(undefined8 *)(lVar8 + 0x49);
              local_a8[0x18] = (undefined1)((ulong)*(undefined8 *)(lVar8 + 0x49) >> 0x38);
              local_a8._25_7_ = (undefined7)*(undefined8 *)(lVar8 + 0x51);
              uStack_88 = (uchar)((ulong)*(undefined8 *)(lVar8 + 0x51) >> 0x38);
              local_a8._1_7_ = (undefined7)*(undefined8 *)(lVar8 + 0x39);
              local_a8[8] = (undefined1)((ulong)*(undefined8 *)(lVar8 + 0x39) >> 0x38);
              local_a8._9_7_ = (undefined7)*(undefined8 *)(lVar8 + 0x41);
              local_a8[0x10] = (undefined1)((ulong)*(undefined8 *)(lVar8 + 0x41) >> 0x38);
              bVar22 = CTxMemPool::exists(mempool,(GenTxid *)local_a8);
              if (bVar22) {
                base_blob<256u>::ToString_abi_cxx11_
                          (&local_58,(void *)((long)p_Var21[1]._M_next + 0x59));
                tinyformat::format<std::__cxx11::string>
                          ((string *)local_a8,
                           (tinyformat *)"tx %s should not be in mempool as it was replaced",
                           (char *)&local_58,pbVar18);
                goto LAB_0083d9fa;
              }
            }
          }
          pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &pbVar17->field_2;
        } while (pbVar17 != pbVar4);
      }
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      goto LAB_0083da7b;
    }
    ValidationState<PackageValidationResult>::ToString_abi_cxx11_
              (&local_58,(ValidationState<PackageValidationResult> *)result);
    tinyformat::format<std::__cxx11::string>
              ((string *)local_a8,(tinyformat *)"Package validation unexpectedly failed: %s",
               (char *)&local_58,pbVar17);
  }
LAB_0083d9fa:
  puVar1 = (undefined8 *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x10);
  *(undefined8 **)
   &(__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload = puVar1;
  pcVar6 = local_a8 + 0x10;
  _Var11._M_p._1_7_ = local_a8._1_7_;
  _Var11._M_p._0_1_ = local_a8[0];
  if (_Var11._M_p == pcVar6) {
    *puVar1 = CONCAT71(local_a8._17_7_,local_a8[0x10]);
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 0x18) = CONCAT71(local_a8._25_7_,local_a8[0x18]);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = _Var11._M_p;
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 0x10) = CONCAT71(local_a8._17_7_,local_a8[0x10]);
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = CONCAT71(local_a8._9_7_,local_a8[8]);
  local_a8[0] = SUB81(pcVar6,0);
  local_a8._1_7_ = (undefined7)((ulong)pcVar6 >> 8);
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  local_a8[0x10] = '\0';
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = true;
LAB_0083da44:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
LAB_0083da7b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> CheckPackageMempoolAcceptResult(const Package& txns,
                                                           const PackageMempoolAcceptResult& result,
                                                           bool expect_valid,
                                                           const CTxMemPool* mempool)
{
    if (expect_valid) {
        if (result.m_state.IsInvalid()) {
            return strprintf("Package validation unexpectedly failed: %s", result.m_state.ToString());
        }
    } else {
        if (result.m_state.IsValid()) {
            return strprintf("Package validation unexpectedly succeeded. %s", result.m_state.ToString());
        }
    }
    if (result.m_state.GetResult() != PackageValidationResult::PCKG_POLICY && txns.size() != result.m_tx_results.size()) {
        return strprintf("txns size %u does not match tx results size %u", txns.size(), result.m_tx_results.size());
    }
    for (const auto& tx : txns) {
        const auto& wtxid = tx->GetWitnessHash();
        if (result.m_tx_results.count(wtxid) == 0) {
            return strprintf("result not found for tx %s", wtxid.ToString());
        }

        const auto& atmp_result = result.m_tx_results.at(wtxid);
        const bool valid{atmp_result.m_result_type == MempoolAcceptResult::ResultType::VALID};
        if (expect_valid && atmp_result.m_state.IsInvalid()) {
            return strprintf("tx %s unexpectedly failed: %s", wtxid.ToString(), atmp_result.m_state.ToString());
        }

        // Each subpackage is allowed MAX_REPLACEMENT_CANDIDATES replacements (only checking individually here)
        if (atmp_result.m_replaced_transactions.size() > MAX_REPLACEMENT_CANDIDATES) {
            return strprintf("tx %s result replaced too many transactions",
                                wtxid.ToString());
        }

        // Replacements can't happen for subpackages larger than 2
        if (!atmp_result.m_replaced_transactions.empty() &&
            atmp_result.m_wtxids_fee_calculations.has_value() && atmp_result.m_wtxids_fee_calculations.value().size() > 2) {
             return strprintf("tx %s was part of a too-large package RBF subpackage",
                                wtxid.ToString());
        }

        if (!atmp_result.m_replaced_transactions.empty() && mempool) {
            LOCK(mempool->cs);
            // If replacements occurred and it used 2 transactions, this is a package RBF and should result in a cluster of size 2
            if (atmp_result.m_wtxids_fee_calculations.has_value() && atmp_result.m_wtxids_fee_calculations.value().size() == 2) {
                const auto cluster = mempool->GatherClusters({tx->GetHash()});
                if (cluster.size() != 2) return strprintf("tx %s has too many ancestors or descendants for a package rbf", wtxid.ToString());
            }
        }

        // m_vsize and m_base_fees should exist iff the result was VALID or MEMPOOL_ENTRY
        const bool mempool_entry{atmp_result.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY};
        if (atmp_result.m_base_fees.has_value() != (valid || mempool_entry)) {
            return strprintf("tx %s result should %shave m_base_fees", wtxid.ToString(), valid || mempool_entry ? "" : "not ");
        }
        if (atmp_result.m_vsize.has_value() != (valid || mempool_entry)) {
            return strprintf("tx %s result should %shave m_vsize", wtxid.ToString(), valid || mempool_entry ? "" : "not ");
        }

        // m_other_wtxid should exist iff the result was DIFFERENT_WITNESS
        const bool diff_witness{atmp_result.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS};
        if (atmp_result.m_other_wtxid.has_value() != diff_witness) {
            return strprintf("tx %s result should %shave m_other_wtxid", wtxid.ToString(), diff_witness ? "" : "not ");
        }

        // m_effective_feerate and m_wtxids_fee_calculations should exist iff the result was valid
        // or if the failure was TX_RECONSIDERABLE
        const bool valid_or_reconsiderable{atmp_result.m_result_type == MempoolAcceptResult::ResultType::VALID ||
                    atmp_result.m_state.GetResult() == TxValidationResult::TX_RECONSIDERABLE};
        if (atmp_result.m_effective_feerate.has_value() != valid_or_reconsiderable) {
            return strprintf("tx %s result should %shave m_effective_feerate",
                                    wtxid.ToString(), valid ? "" : "not ");
        }
        if (atmp_result.m_wtxids_fee_calculations.has_value() != valid_or_reconsiderable) {
            return strprintf("tx %s result should %shave m_effective_feerate",
                                    wtxid.ToString(), valid ? "" : "not ");
        }

        if (mempool) {
            // The tx by txid should be in the mempool iff the result was not INVALID.
            const bool txid_in_mempool{atmp_result.m_result_type != MempoolAcceptResult::ResultType::INVALID};
            if (mempool->exists(GenTxid::Txid(tx->GetHash())) != txid_in_mempool) {
                return strprintf("tx %s should %sbe in mempool", wtxid.ToString(), txid_in_mempool ? "" : "not ");
            }
            // Additionally, if the result was DIFFERENT_WITNESS, we shouldn't be able to find the tx in mempool by wtxid.
            if (tx->HasWitness() && atmp_result.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS) {
                if (mempool->exists(GenTxid::Wtxid(wtxid))) {
                    return strprintf("wtxid %s should not be in mempool", wtxid.ToString());
                }
            }
            for (const auto& tx_ref : atmp_result.m_replaced_transactions) {
                if (mempool->exists(GenTxid::Txid(tx_ref->GetHash()))) {
                    return strprintf("tx %s should not be in mempool as it was replaced", tx_ref->GetWitnessHash().ToString());
                }
            }
        }
    }
    return std::nullopt;
}